

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::CompletePolymorphicInlining
          (Inline *this,Instr *callInstr,RegOpnd *returnValueOpnd,LabelInstr *doneLabel,
          Instr *dispatchStartLabel,Instr *ldMethodFldInstr,BailOutKind bailoutKind)

{
  anon_class_16_2_83211233 callback;
  IRType type;
  ValueType valueType;
  BranchInstr *instr;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  ByteCodeUsesInstr *this_00;
  Opnd *originalOperand;
  Instr *pIVar1;
  IntConstOpnd *newSrc;
  StackSym *this_01;
  RegOpnd *pRVar2;
  Opnd *dstOpnd;
  StackSym *returnValueSym;
  Instr *endCallInstr;
  ByteCodeUsesInstr *bytecodeUses;
  uint local_44;
  LabelInstr *pLStack_40;
  uint actualsCount;
  LabelInstr *bailOutLabel;
  Instr *ldMethodFldInstr_local;
  Instr *dispatchStartLabel_local;
  LabelInstr *doneLabel_local;
  RegOpnd *returnValueOpnd_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  bailOutLabel = (LabelInstr *)ldMethodFldInstr;
  ldMethodFldInstr_local = dispatchStartLabel;
  dispatchStartLabel_local = &doneLabel->super_Instr;
  doneLabel_local = (LabelInstr *)returnValueOpnd;
  returnValueOpnd_local = (RegOpnd *)callInstr;
  callInstr_local = (Instr *)this;
  pLStack_40 = IR::LabelInstr::New(Label,callInstr->m_func,true);
  IR::Instr::InsertBefore((Instr *)returnValueOpnd_local,&pLStack_40->super_Instr);
  pIVar1 = ldMethodFldInstr_local;
  instr = IR::BranchInstr::New(Br,pLStack_40,(Func *)returnValueOpnd_local[1].super_Opnd._vptr_Opnd)
  ;
  IR::Instr::InsertBefore(pIVar1,&instr->super_Instr);
  if (bailOutLabel != (LabelInstr *)0x0) {
    IR::Instr::InsertBefore((Instr *)returnValueOpnd_local,&bailOutLabel->super_Instr);
  }
  pRVar2 = returnValueOpnd_local;
  instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (BailOnNotPolymorphicInlinee,bailoutKind,(Instr *)returnValueOpnd_local,
                        (Func *)returnValueOpnd_local[1].super_Opnd._vptr_Opnd);
  IR::Instr::InsertBefore((Instr *)pRVar2,&instr_00->super_Instr);
  local_44 = 0;
  callback.actualsCount = &local_44;
  callback.callInstr = (Instr **)&returnValueOpnd_local;
  IR::Instr::
  IterateArgInstrs<Inline::CompletePolymorphicInlining(IR::Instr*,IR::RegOpnd*,IR::LabelInstr*,IR::Instr*,IR::Instr*,IR::BailOutKind)::__0>
            ((Instr *)returnValueOpnd_local,callback);
  this_00 = IR::ByteCodeUsesInstr::New((Instr *)returnValueOpnd_local);
  originalOperand = IR::Instr::GetSrc1((Instr *)returnValueOpnd_local);
  IR::ByteCodeUsesInstr::Set(this_00,originalOperand);
  IR::Instr::InsertBefore((Instr *)returnValueOpnd_local,&this_00->super_Instr);
  pIVar1 = IR::Instr::New(EndCallForPolymorphicInlinee,
                          (Func *)returnValueOpnd_local[1].super_Opnd._vptr_Opnd);
  newSrc = IR::IntConstOpnd::New
                     ((ulong)(local_44 + 3),TyInt32,
                      (Func *)returnValueOpnd_local[1].super_Opnd._vptr_Opnd,true);
  IR::Instr::SetSrc1(pIVar1,&newSrc->super_Opnd);
  if (doneLabel_local != (LabelInstr *)0x0) {
    this_01 = Sym::AsStackSym((Sym *)(doneLabel_local->super_Instr).m_next);
    type = StackSym::GetType(this_01);
    pRVar2 = IR::RegOpnd::New(this_01,type,(Func *)returnValueOpnd_local[1].super_Opnd._vptr_Opnd);
    valueType = IR::Opnd::GetValueType((Opnd *)doneLabel_local);
    IR::Opnd::SetValueType(&pRVar2->super_Opnd,valueType);
    IR::Instr::SetDst(pIVar1,&pRVar2->super_Opnd);
  }
  IR::Instr::InsertBefore((Instr *)returnValueOpnd_local,pIVar1);
  IR::Instr::InsertBefore((Instr *)returnValueOpnd_local,dispatchStartLabel_local);
  IR::Instr::Remove((Instr *)returnValueOpnd_local);
  return;
}

Assistant:

void Inline::CompletePolymorphicInlining(IR::Instr* callInstr, IR::RegOpnd* returnValueOpnd, IR::LabelInstr* doneLabel, IR::Instr* dispatchStartLabel, IR::Instr* ldMethodFldInstr, IR::BailOutKind bailoutKind)
{
    // Label $bailout:
    // LdMethodFldPolyInlineMiss
    // BailOnNotPolymorphicInlinee $callOutBytecodeOffset - BailOutOnFailedPolymorphicInlineTypeCheck
    // ByteCoudeUses
    // BytecodeArgoutUses
    // returnValueOpnd = EndCallForPolymorphicInlinee actualsCount
    IR::LabelInstr* bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, /*helperLabel*/ true);
    callInstr->InsertBefore(bailOutLabel);
    dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::Br, bailOutLabel, callInstr->m_func));

    // Only fixed function inlining requires a ldMethodFldInstr
    if (ldMethodFldInstr)
    {
        callInstr->InsertBefore(ldMethodFldInstr);
    }

    callInstr->InsertBefore(IR::BailOutInstr::New(Js::OpCode::BailOnNotPolymorphicInlinee, bailoutKind, callInstr, callInstr->m_func));

    uint actualsCount = 0;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        IR::Instr* bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
        bytecodeArgOutUse->SetByteCodeOffset(callInstr);
        bytecodeArgOutUse->SetSrc1(argInstr->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse);
        actualsCount++;
        // Remove the original args
        argInstr->Remove();
        return false;
    });
    IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
    bytecodeUses->Set(callInstr->GetSrc1());
    callInstr->InsertBefore(bytecodeUses);

    IR::Instr* endCallInstr = IR::Instr::New(Js::OpCode::EndCallForPolymorphicInlinee, callInstr->m_func);
    endCallInstr->SetSrc1(IR::IntConstOpnd::New(actualsCount + Js::Constants::InlineeMetaArgCount, TyInt32, callInstr->m_func, /*dontEncode*/ true));
    if (returnValueOpnd)
    {
        StackSym* returnValueSym = returnValueOpnd->m_sym->AsStackSym();
        IR::Opnd* dstOpnd = IR::RegOpnd::New(returnValueSym, returnValueSym->GetType(), callInstr->m_func);
        dstOpnd->SetValueType(returnValueOpnd->GetValueType());
        endCallInstr->SetDst(dstOpnd);
    }
    callInstr->InsertBefore(endCallInstr);
    callInstr->InsertBefore(doneLabel);
    callInstr->Remove(); // We don't need callInstr anymore.
}